

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreePrevious(BtCursor *pCur)

{
  MemPage *pMVar1;
  u32 newPgno;
  int iVar2;
  int local_30;
  int idx;
  MemPage *pPage;
  int rc;
  BtCursor *pCur_local;
  
  if (pCur->eState != '\x01') {
    if (pCur->eState < 3) {
      local_30 = 0;
    }
    else {
      local_30 = btreeRestoreCursorPosition(pCur);
    }
    if (local_30 != 0) {
      return local_30;
    }
    if (pCur->eState == '\0') {
      return 0x65;
    }
    if (pCur->skipNext != 0) {
      pCur->eState = '\x01';
      if (pCur->skipNext < 0) {
        pCur->skipNext = 0;
        return 0;
      }
      pCur->skipNext = 0;
    }
  }
  pMVar1 = pCur->apPage[pCur->iPage];
  if (pMVar1->leaf == '\0') {
    newPgno = sqlite3Get4byte(pMVar1->aData +
                              (int)(uint)(pMVar1->maskPage &
                                         CONCAT11(pMVar1->aCellIdx[(int)((uint)pCur->ix << 1)],
                                                  pMVar1->aCellIdx
                                                  [(long)(int)((uint)pCur->ix << 1) + 1])));
    iVar2 = moveToChild(pCur,newPgno);
    if (iVar2 != 0) {
      return iVar2;
    }
    pPage._4_4_ = moveToRightmost(pCur);
  }
  else {
    while (pCur->ix == 0) {
      if (pCur->iPage == '\0') {
        pCur->eState = '\0';
        return 0x65;
      }
      moveToParent(pCur);
    }
    pCur->ix = pCur->ix - 1;
    if ((pCur->apPage[pCur->iPage]->intKey == '\0') || (pCur->apPage[pCur->iPage]->leaf != '\0')) {
      pPage._4_4_ = 0;
    }
    else {
      pPage._4_4_ = sqlite3BtreePrevious(pCur,0);
    }
  }
  return pPage._4_4_;
}

Assistant:

static SQLITE_NOINLINE int btreePrevious(BtCursor *pCur){
  int rc;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  assert( (pCur->curFlags & (BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey))==0 );
  assert( pCur->info.nSize==0 );
  if( pCur->eState!=CURSOR_VALID ){
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->skipNext ){
      assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_SKIPNEXT );
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext<0 ){
        pCur->skipNext = 0;
        return SQLITE_OK;
      }
      pCur->skipNext = 0;
    }
  }

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->ix;
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ) return rc;
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->ix==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
    }
    assert( pCur->info.nSize==0 );
    assert( (pCur->curFlags & (BTCF_ValidOvfl))==0 );

    pCur->ix--;
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, 0);
    }else{
      rc = SQLITE_OK;
    }
  }
  return rc;
}